

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctSortTree::BuildRun
          (WindowDistinctSortTree *this,idx_t level_nr,idx_t run_idx,
          WindowDistinctAggregatorLocalState *ldastate)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  Vector *pVVar1;
  ulong uVar2;
  atomic<unsigned_long> *paVar3;
  DataChunk *this_01;
  SelectionVector *sel_vector;
  Vector *pVVar4;
  Vector *pVVar5;
  WindowDistinctAggregatorGlobalState *pWVar6;
  WindowDistinctAggregatorGlobalState *pWVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  Vector *pVVar11;
  pointer pWVar12;
  DataChunk *chunk;
  reference this_02;
  reference this_03;
  ulong uVar13;
  reference pvVar14;
  reference pvVar15;
  ulong uVar16;
  ulong uVar17;
  pointer puVar18;
  pointer puVar19;
  idx_t j;
  ulong __n;
  idx_t iVar20;
  idx_t count_p;
  AggregateInputData aggr_input_data;
  
  pWVar6 = this->gdastate;
  this_00 = &(ldastate->super_WindowAggregatorLocalState).cursor;
  pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator->(this_00);
  chunk = &pWVar12->chunk;
  pWVar7 = this->gdastate;
  this_01 = &ldastate->leaves;
  sel_vector = &ldastate->sel;
  aggr_input_data.bind_data.ptr =
       AggregateObject::GetFunctionData(&(pWVar6->super_WindowAggregatorGlobalState).aggr);
  aggr_input_data.combine_type = PRESERVE_INPUT;
  pVVar1 = &ldastate->update_v;
  pdVar8 = (ldastate->update_v).data;
  pdVar9 = (ldastate->source_v).data;
  pVVar4 = &ldastate->source_v;
  pVVar5 = &ldastate->target_v;
  pdVar10 = (ldastate->target_v).data;
  aggr_input_data.allocator =
       &(pWVar6->super_WindowAggregatorGlobalState).super_WindowAggregatorState.allocator;
  this_02 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::get<true>(&(this->gdastate->zipped_tree).tree,level_nr);
  this_03 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                         *)this,level_nr);
  iVar20 = (this->
           super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>).
           build_run_length;
  __n = run_idx * iVar20;
  uVar17 = (long)(this_02->first).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this_02->first).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar13 = iVar20 + __n;
  if (uVar17 < uVar13) {
    uVar13 = uVar17;
  }
  uVar2 = __n + 1;
  iVar20 = 0;
  count_p = 0;
  puVar18 = (pointer)0x0;
  for (; __n < uVar13; __n = __n + 1) {
    puVar19 = (pWVar7->levels_flat_native).states.
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
              (uVar17 * level_nr + __n) * (pWVar7->levels_flat_native).state_size;
    pvVar14 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>(&this_02->first,__n)
    ;
    uVar16 = (pvVar14->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
             super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    pvVar15 = vector<unsigned_long,_true>::get<true>(&this_03->first,__n);
    *pvVar15 = uVar16;
    if (uVar16 < uVar2) {
      pvVar14 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>
                          (&this_02->first,__n);
      uVar16 = (pvVar14->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
               super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
               _M_head_impl;
      pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
                operator->(this_00);
      if (((pWVar12->state).next_row_index <= uVar16) ||
         (uVar16 < (pWVar12->state).current_row_index)) {
        DataChunk::Reference(this_01,chunk);
        DataChunk::Slice(this_01,sel_vector,count_p);
        pVVar11 = (ldastate->leaves).data.
                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (*(pWVar6->super_WindowAggregatorGlobalState).aggr.function.update)
                  (pVVar11,&aggr_input_data,
                   ((long)(ldastate->leaves).data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar11) / 0x68,pVVar1,
                   count_p);
        (*(pWVar6->super_WindowAggregatorGlobalState).aggr.function.combine)
                  (pVVar4,pVVar5,&aggr_input_data,iVar20);
        pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                  ::operator->(this_00);
        WindowCursor::Seek(pWVar12,uVar16);
        iVar20 = 0;
        count_p = 0;
      }
      *(pointer *)(pdVar8 + count_p * 8) = puVar19;
      pWVar12 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
                operator->(this_00);
      sel_vector->sel_vector[count_p] = (int)uVar16 - (int)(pWVar12->state).current_row_index;
      count_p = count_p + 1;
    }
    if (puVar18 != (pointer)0x0) {
      *(pointer *)(pdVar9 + iVar20 * 8) = puVar18;
      *(pointer *)(pdVar10 + iVar20 * 8) = puVar19;
      iVar20 = iVar20 + 1;
    }
    uVar16 = count_p;
    if (count_p < iVar20) {
      uVar16 = iVar20;
    }
    if (0x7ff < uVar16) {
      DataChunk::Reference(this_01,chunk);
      DataChunk::Slice(this_01,sel_vector,count_p);
      pVVar11 = (ldastate->leaves).data.
                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*(pWVar6->super_WindowAggregatorGlobalState).aggr.function.update)
                (pVVar11,&aggr_input_data,
                 ((long)(ldastate->leaves).data.
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pVVar11) / 0x68,pVVar1,count_p);
      (*(pWVar6->super_WindowAggregatorGlobalState).aggr.function.combine)
                (pVVar4,pVVar5,&aggr_input_data,iVar20);
      iVar20 = 0;
      count_p = 0;
    }
    puVar18 = puVar19;
  }
  if (iVar20 != 0 || count_p != 0) {
    DataChunk::Reference(this_01,chunk);
    DataChunk::Slice(this_01,sel_vector,count_p);
    pVVar11 = (ldastate->leaves).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*(pWVar6->super_WindowAggregatorGlobalState).aggr.function.update)
              (pVVar11,&aggr_input_data,
               ((long)(ldastate->leaves).data.
                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pVVar11) / 0x68,pVVar1,count_p);
    (*(pWVar6->super_WindowAggregatorGlobalState).aggr.function.combine)
              (pVVar4,pVVar5,&aggr_input_data,iVar20);
  }
  LOCK();
  paVar3 = &(this->
            super_MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>)
            .build_complete;
  (paVar3->super___atomic_base<unsigned_long>)._M_i =
       (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void WindowDistinctSortTree::BuildRun(idx_t level_nr, idx_t run_idx, WindowDistinctAggregatorLocalState &ldastate) {
	auto &aggr = gdastate.aggr;
	auto &allocator = gdastate.allocator;
	auto &inputs = ldastate.cursor->chunk;
	auto &levels_flat_native = gdastate.levels_flat_native;

	//! Input data chunk, used for leaf segment aggregation
	auto &leaves = ldastate.leaves;
	auto &sel = ldastate.sel;

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);

	//! The states to update
	auto &update_v = ldastate.update_v;
	auto updates = FlatVector::GetData<data_ptr_t>(update_v);

	auto &source_v = ldastate.source_v;
	auto sources = FlatVector::GetData<data_ptr_t>(source_v);
	auto &target_v = ldastate.target_v;
	auto targets = FlatVector::GetData<data_ptr_t>(target_v);

	auto &zipped_tree = gdastate.zipped_tree;
	auto &zipped_level = zipped_tree.tree[level_nr].first;
	auto &level = tree[level_nr].first;

	//	Reset the combine state
	idx_t nupdate = 0;
	idx_t ncombine = 0;
	data_ptr_t prev_state = nullptr;
	idx_t i = run_idx * build_run_length;
	auto next_limit = MinValue<idx_t>(zipped_level.size(), i + build_run_length);
	idx_t levels_flat_offset = level_nr * zipped_level.size() + i;
	for (auto j = i; j < next_limit; ++j) {
		//	Initialise the next aggregate
		auto curr_state = levels_flat_native.GetStatePtr(levels_flat_offset++);

		//	Update this state (if it matches)
		const auto prev_idx = std::get<0>(zipped_level[j]);
		level[j] = prev_idx;
		if (prev_idx < i + 1) {
			const auto update_idx = std::get<1>(zipped_level[j]);
			if (!ldastate.cursor->RowIsVisible(update_idx)) {
				// 	Flush if we have to move the cursor
				//	Push the updates first so they propagate
				leaves.Reference(inputs);
				leaves.Slice(sel, nupdate);
				aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
				nupdate = 0;

				//	Combine the states sequentially
				aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
				ncombine = 0;

				// Move the update into range.
				ldastate.cursor->Seek(update_idx);
			}

			updates[nupdate] = curr_state;
			//	input_idx
			sel[nupdate] = ldastate.cursor->RowOffset(update_idx);
			++nupdate;
		}

		//	Merge the previous state (if any)
		if (prev_state) {
			sources[ncombine] = prev_state;
			targets[ncombine] = curr_state;
			++ncombine;
		}
		prev_state = curr_state;

		//	Flush the states if one is maxed out.
		if (MaxValue<idx_t>(ncombine, nupdate) >= STANDARD_VECTOR_SIZE) {
			//	Push the updates first so they propagate
			leaves.Reference(inputs);
			leaves.Slice(sel, nupdate);
			aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
			nupdate = 0;

			//	Combine the states sequentially
			aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
			ncombine = 0;
		}
	}

	//	Flush any remaining states
	if (ncombine || nupdate) {
		//	Push  the updates
		leaves.Reference(inputs);
		leaves.Slice(sel, nupdate);
		aggr.function.update(leaves.data.data(), aggr_input_data, leaves.ColumnCount(), update_v, nupdate);
		nupdate = 0;

		//	Combine the states sequentially
		aggr.function.combine(source_v, target_v, aggr_input_data, ncombine);
		ncombine = 0;
	}

	++build_complete;
}